

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool list_reverse(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  char *pcVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  gravity_fiber_t *fiber;
  long lVar6;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar7;
  long lVar8;
  gravity_class_t *pgVar9;
  gravity_value_t value;
  char _buffer [4096];
  char local_1028 [8];
  undefined7 uStack_1020;
  undefined1 uStack_1019;
  undefined7 uStack_1018;
  char acStack_1011 [4081];
  
  if (nargs < 2) {
    aVar7 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(args->field_1).p;
    uVar5 = (uint)(aVar7.p)->objclass >> 1;
    if (uVar5 != 0) {
      lVar6 = ((ulong)(aVar7.p)->objclass & 0xffffffff) << 4;
      lVar8 = 0;
      do {
        lVar6 = lVar6 + -0x10;
        lVar2 = *(long *)&(aVar7.p)->has_outer;
        local_1028 = *(char (*) [8])(lVar2 + lVar6);
        uVar3 = *(undefined8 *)((char *)(lVar2 + lVar6) + 8);
        uStack_1020 = (undefined7)uVar3;
        uStack_1019 = (undefined1)((ulong)uVar3 >> 0x38);
        uVar4 = ((undefined8 *)(lVar2 + lVar8))[1];
        *(undefined8 *)(lVar2 + lVar6) = *(undefined8 *)(lVar2 + lVar8);
        ((undefined8 *)(lVar2 + lVar6))[1] = uVar4;
        pcVar1 = (char *)(*(long *)&(aVar7.p)->has_outer + lVar8);
        *(char (*) [8])pcVar1 = local_1028;
        *(undefined8 *)(pcVar1 + 8) = uVar3;
        lVar8 = lVar8 + 0x10;
      } while ((ulong)uVar5 << 4 != lVar8);
    }
    pgVar9 = (aVar7.p)->isa;
  }
  else {
    uStack_1018 = 0x67726120666f20;
    builtin_strncpy(acStack_1011,"uments.",8);
    builtin_strncpy(local_1028,"Incorrec",8);
    uStack_1020 = 0x65626d756e2074;
    uStack_1019 = 0x72;
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    aVar7.n = 0;
    pgVar9 = gravity_class_null;
  }
  value.field_1.n = aVar7.n;
  value.isa = pgVar9;
  gravity_vm_setslot(vm,value,rindex);
  return nargs < 2;
}

Assistant:

static bool list_reverse (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
  if (nargs > 1) RETURN_ERROR("Incorrect number of arguments.");
  gravity_value_t value = GET_VALUE(0);                            // self parameter
  gravity_list_t *list = VALUE_AS_LIST(value);
  uint32_t count = (uint32_t)marray_size(list->array);
  gravity_int_t i = 0;

  while (i < count/2) {
    gravity_value_t tmp = marray_get(list->array, count-i-1);
    marray_set(list->array, count-i-1,  marray_get(list->array, i));
    marray_set(list->array, i,  tmp);
    i++;
  }

  RETURN_VALUE(VALUE_FROM_OBJECT(list), rindex);
}